

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.h
# Opt level: O3

void __thiscall chrono::ChLink::ChLink(ChLink *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  ChObj::ChObj((ChObj *)this);
  *(undefined8 *)
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.offset_w = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.offset_L = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.system = (ChSystem *)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined2 *)&(this->super_ChLinkBase).super_ChPhysicsItem.field_0x74 = 0x100;
  (this->super_ChLinkBase).super_ChPhysicsItem.field_0x76 = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_00b15e40;
  this->Body1 = (ChBodyFrame *)SUB168(ZEXT416(0) << 0x40,0);
  this->Body2 = (ChBodyFrame *)SUB168(ZEXT416(0) << 0x40,8);
  auVar1._8_8_ = DAT_00b689a0;
  auVar1._0_8_ = VNULL;
  auVar3._8_8_ = DAT_00b689a8;
  auVar3._0_8_ = DAT_00b689a0;
  auVar2 = vunpcklpd_avx(auVar1,auVar3);
  auVar1 = vshufpd_avx(auVar3,auVar1,1);
  *(undefined1 (*) [16])((this->react_force).m_data + 2) = auVar1;
  *(undefined1 (*) [16])(this->react_force).m_data = auVar2;
  *(undefined1 (*) [16])((this->react_torque).m_data + 1) = auVar3;
  return;
}

Assistant:

virtual ~ChLink() {}